

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  char *in_RSI;
  int *in_RDI;
  int j;
  char *arg;
  string arg_string;
  int i;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9b;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  char *flag;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  int local_50;
  char **in_stack_ffffffffffffffb8;
  Int32 *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  int local_14;
  
  for (local_14 = 1; local_14 < *in_RDI; local_14 = local_14 + 1) {
    flag = &stack0xffffffffffffffc8;
    StreamableToString<char*>(in_stack_ffffffffffffffb8);
    std::__cxx11::string::c_str();
    in_stack_ffffffffffffffaf =
         ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),flag,
                       (bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                        CONCAT16(in_stack_ffffffffffffff9e,
                                                 CONCAT15(in_stack_ffffffffffffff9d,
                                                          CONCAT14(in_stack_ffffffffffffff9c,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff9b,
                                                  CONCAT12(in_stack_ffffffffffffff9a,
                                                           CONCAT11(in_stack_ffffffffffffff99,
                                                                    in_stack_ffffffffffffff98)))))))
                      );
    if ((((((bool)in_stack_ffffffffffffffaf) ||
          (in_stack_ffffffffffffff9f =
                ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                              flag,(bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                    CONCAT16(in_stack_ffffffffffffff9e,
                                                             CONCAT15(in_stack_ffffffffffffff9d,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
          (bool)in_stack_ffffffffffffff9f)) ||
         (in_stack_ffffffffffffff9e =
               ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                             flag,(bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                   CONCAT16(in_stack_ffffffffffffff9e,
                                                            CONCAT15(in_stack_ffffffffffffff9d,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
         (bool)in_stack_ffffffffffffff9e)) ||
        (((in_stack_ffffffffffffff9d =
                ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                 CONCAT16(in_stack_ffffffffffffff9e,
                                                          CONCAT15(in_stack_ffffffffffffff9d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98))))))),
                                (char *)CONCAT17(in_stack_ffffffffffffff97,
                                                 CONCAT16(in_stack_ffffffffffffff96,
                                                          CONCAT15(in_stack_ffffffffffffff95,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))),
                                (string *)
                                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
          (bool)in_stack_ffffffffffffff9d ||
          (in_stack_ffffffffffffff9c =
                ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                 CONCAT16(in_stack_ffffffffffffff9e,
                                                          CONCAT15(in_stack_ffffffffffffff9d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98))))))),
                                (char *)CONCAT17(in_stack_ffffffffffffff97,
                                                 CONCAT16(in_stack_ffffffffffffff96,
                                                          CONCAT15(in_stack_ffffffffffffff95,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))),
                                (string *)
                                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
          (bool)in_stack_ffffffffffffff9c)) ||
         ((in_stack_ffffffffffffff9b =
                ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                              flag,(bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                    CONCAT16(in_stack_ffffffffffffff9e,
                                                             CONCAT15(in_stack_ffffffffffffff9d,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
          (bool)in_stack_ffffffffffffff9b ||
          ((in_stack_ffffffffffffff9a =
                 ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98))))))),
                                 (char *)CONCAT17(in_stack_ffffffffffffff97,
                                                  CONCAT16(in_stack_ffffffffffffff96,
                                                           CONCAT15(in_stack_ffffffffffffff95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))),
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
           (bool)in_stack_ffffffffffffff9a ||
           (in_stack_ffffffffffffff99 =
                 ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98))))))),
                                 (char *)CONCAT17(in_stack_ffffffffffffff97,
                                                  CONCAT16(in_stack_ffffffffffffff96,
                                                           CONCAT15(in_stack_ffffffffffffff95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))),
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
           (bool)in_stack_ffffffffffffff99)))))))) ||
       ((in_stack_ffffffffffffff98 =
              ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                            flag,(bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
        (bool)in_stack_ffffffffffffff98 ||
        (((((in_stack_ffffffffffffff97 =
                  ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                   CONCAT16(in_stack_ffffffffffffff9e,
                                                            CONCAT15(in_stack_ffffffffffffff9d,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98))))))),
                                  (char *)CONCAT17(in_stack_ffffffffffffff97,
                                                   CONCAT16(in_stack_ffffffffffffff96,
                                                            CONCAT15(in_stack_ffffffffffffff95,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))),
                                  (string *)
                                  CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
            (bool)in_stack_ffffffffffffff97 ||
            (in_stack_ffffffffffffff96 =
                  ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8
                                                ),flag,
                                (bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                 CONCAT16(in_stack_ffffffffffffff9e,
                                                          CONCAT15(in_stack_ffffffffffffff9d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
            (bool)in_stack_ffffffffffffff96)) ||
           (in_stack_ffffffffffffff95 =
                 ParseInt32Flag(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffc8), (bool)in_stack_ffffffffffffff95)) ||
          ((in_stack_ffffffffffffff94 =
                 ParseInt32Flag(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffc8), (bool)in_stack_ffffffffffffff94 ||
           (in_stack_ffffffffffffff93 =
                 ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                               ,flag,(bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                      CONCAT16(in_stack_ffffffffffffff9e,
                                                               CONCAT15(in_stack_ffffffffffffff9d,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
           (bool)in_stack_ffffffffffffff93)))) ||
         ((in_stack_ffffffffffffff92 =
                ParseInt32Flag(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8), (bool)in_stack_ffffffffffffff92 ||
          ((in_stack_ffffffffffffff91 =
                 ParseStringFlag((char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98))))))),
                                 (char *)CONCAT17(in_stack_ffffffffffffff97,
                                                  CONCAT16(in_stack_ffffffffffffff96,
                                                           CONCAT15(in_stack_ffffffffffffff95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))),
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
           (bool)in_stack_ffffffffffffff91 ||
           (in_stack_ffffffffffffff90 =
                 ParseBoolFlag((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                               ,flag,(bool *)CONCAT17(in_stack_ffffffffffffff9f,
                                                      CONCAT16(in_stack_ffffffffffffff9e,
                                                               CONCAT15(in_stack_ffffffffffffff9d,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  CONCAT13(in_stack_ffffffffffffff9b,
                                                           CONCAT12(in_stack_ffffffffffffff9a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff99,
                                                  in_stack_ffffffffffffff98)))))))),
           (bool)in_stack_ffffffffffffff90)))))))))) {
      for (local_50 = local_14; local_50 != *in_RDI; local_50 = local_50 + 1) {
        *(undefined8 *)(in_RSI + (long)local_50 * 8) =
             *(undefined8 *)(in_RSI + (long)(local_50 + 1) * 8);
      }
      *in_RDI = *in_RDI + -1;
      local_14 = local_14 + -1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff97,
                                       CONCAT16(in_stack_ffffffffffffff96,
                                                CONCAT15(in_stack_ffffffffffffff95,
                                                         CONCAT14(in_stack_ffffffffffffff94,
                                                                  CONCAT13(in_stack_ffffffffffffff93
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffff92,
                                                  CONCAT11(in_stack_ffffffffffffff91,
                                                           in_stack_ffffffffffffff90))))))),
                              (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88))
      ;
      if ((((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_ffffffffffffff97,
                                                CONCAT16(in_stack_ffffffffffffff96,
                                                         CONCAT15(in_stack_ffffffffffffff95,
                                                                  CONCAT14(in_stack_ffffffffffffff94
                                                                           ,CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                                    ,(char *)CONCAT17(in_stack_ffffffffffffff8f,
                                                      in_stack_ffffffffffffff88)), bVar1)) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffff97,
                                               CONCAT16(in_stack_ffffffffffffff96,
                                                        CONCAT15(in_stack_ffffffffffffff95,
                                                                 CONCAT14(in_stack_ffffffffffffff94,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                                   ,(char *)CONCAT17(in_stack_ffffffffffffff8f,
                                                     in_stack_ffffffffffffff88)), bVar1)) ||
         ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffff97,
                                               CONCAT16(in_stack_ffffffffffffff96,
                                                        CONCAT15(in_stack_ffffffffffffff95,
                                                                 CONCAT14(in_stack_ffffffffffffff94,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                                   ,(char *)CONCAT17(in_stack_ffffffffffffff8f,
                                                     in_stack_ffffffffffffff88)), bVar1 ||
          (in_stack_ffffffffffffff8f =
                HasGoogleTestFlagPrefix
                          ((char *)CONCAT17(in_stack_ffffffffffffff97,
                                            CONCAT16(in_stack_ffffffffffffff96,
                                                     CONCAT15(in_stack_ffffffffffffff95,
                                                              CONCAT14(in_stack_ffffffffffffff94,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffff93,
                                                  CONCAT12(in_stack_ffffffffffffff92,
                                                           CONCAT11(in_stack_ffffffffffffff91,
                                                                    in_stack_ffffffffffffff90)))))))
                          ), (bool)in_stack_ffffffffffffff8f)))) {
        g_help_flag = 1;
      }
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  if ((g_help_flag & 1) != 0) {
    PrintColorEncoded(in_RSI);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}